

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::Q3BSPFileImporter::importTextureFromArchive
          (Q3BSPFileImporter *this,Q3BSPModel *model,ZipArchiveIOSystem *archive,aiScene *param_3,
          aiMaterial *pMatHelper,int textureId)

{
  pointer __s;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  const_reference ppsVar5;
  undefined8 uVar6;
  undefined4 extraout_var;
  aiTexture *this_00;
  void *pvVar7;
  ulong uVar8;
  uchar *puVar9;
  size_t sVar10;
  undefined1 local_980 [8];
  aiString name_1;
  aiString name;
  size_t readSize;
  uchar *pData;
  aiTexture *pTexture_1;
  size_t texSize;
  IOStream *pTextureStream;
  string local_148;
  undefined1 local_128 [8];
  string ext;
  string textureName;
  value_type local_e0;
  allocator<char> local_b9;
  value_type local_b8;
  allocator<char> local_81;
  value_type local_80;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  supportedExtensions;
  sQ3BSPTexture *pTexture;
  bool res;
  int textureId_local;
  aiMaterial *pMatHelper_local;
  aiScene *param_3_local;
  ZipArchiveIOSystem *archive_local;
  Q3BSPModel *model_local;
  Q3BSPFileImporter *this_local;
  
  if ((archive == (ZipArchiveIOSystem *)0x0) || (pMatHelper == (aiMaterial *)0x0)) {
    this_local._7_1_ = false;
  }
  else if ((textureId < 0) ||
          (sVar4 = std::
                   vector<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                   ::size(&model->m_Textures), (int)sVar4 <= textureId)) {
    this_local._7_1_ = false;
  }
  else {
    ppsVar5 = std::
              vector<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
              ::operator[](&model->m_Textures,(long)textureId);
    supportedExtensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppsVar5;
    if ((value_type)
        supportedExtensions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage == (value_type)0x0) {
      this_local._7_1_ = false;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,".jpg",&local_81);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,".png",&local_b9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,".tga",
                 (allocator<char> *)(textureName.field_2._M_local_buf + 0xf));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)(textureName.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string((string *)(ext.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_128);
      __s = supportedExtensions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,(char *)__s,(allocator<char> *)((long)&pTextureStream + 7));
      bVar1 = expandFile(this,archive,&local_148,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_60,(string *)((long)&ext.field_2 + 8),(string *)local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator((allocator<char> *)((long)&pTextureStream + 7));
      if (bVar1) {
        uVar6 = std::__cxx11::string::c_str();
        iVar2 = (*(archive->super_IOSystem)._vptr_IOSystem[4])(archive,uVar6,"rb");
        texSize = CONCAT44(extraout_var,iVar2);
        if ((long *)texSize == (long *)0x0) {
          aiString::aiString((aiString *)local_980);
          strncpy(local_980 + 4,
                  (char *)supportedExtensions.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,0x400);
          sVar10 = strlen(local_980 + 4);
          local_980._0_4_ = (undefined4)sVar10;
          aiMaterial::AddProperty(pMatHelper,(aiString *)local_980,"$tex.file",1,0);
        }
        else {
          pTexture_1 = (aiTexture *)(**(code **)(*(long *)texSize + 0x30))();
          this_00 = (aiTexture *)operator_new(0x428);
          aiTexture::aiTexture(this_00);
          this_00->mHeight = 0;
          this_00->mWidth = (uint)pTexture_1;
          pData = (uchar *)this_00;
          pvVar7 = operator_new__((ulong)this_00->mWidth);
          uVar8 = (**(code **)(*(long *)texSize + 0x10))(texSize,pvVar7,1,*(undefined4 *)pData);
          if (uVar8 != *(uint *)pData) {
            __assert_fail("readSize == pTexture->mWidth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                          ,0x256,
                          "bool Assimp::Q3BSPFileImporter::importTextureFromArchive(const Q3BSP::Q3BSPModel *, ZipArchiveIOSystem *, aiScene *, aiMaterial *, int)"
                         );
          }
          *(void **)(pData + 0x18) = pvVar7;
          puVar9 = (uchar *)std::__cxx11::string::operator[]((ulong)local_128);
          pData[8] = *puVar9;
          puVar9 = (uchar *)std::__cxx11::string::operator[]((ulong)local_128);
          pData[9] = *puVar9;
          puVar9 = (uchar *)std::__cxx11::string::operator[]((ulong)local_128);
          pData[10] = *puVar9;
          pData[0xb] = '\0';
          aiString::aiString((aiString *)(name_1.data + 0x3f8));
          name_1.data[0x3fc] = '*';
          sVar4 = std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::size(&this->mTextures);
          uVar3 = ASSIMP_itoa10(name_1.data + 0x3fd,0x3ff,(int32_t)sVar4);
          name_1.data._1016_4_ = uVar3 + 1;
          (*(archive->super_IOSystem)._vptr_IOSystem[5])(archive,texSize);
          aiMaterial::AddProperty(pMatHelper,(aiString *)(name_1.data + 0x3f8),"$tex.file",1,0);
          std::vector<aiTexture_*,_std::allocator<aiTexture_*>_>::push_back
                    (&this->mTextures,(value_type *)&pData);
        }
      }
      this_local._7_1_ = true;
      std::__cxx11::string::~string((string *)local_128);
      std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Q3BSPFileImporter::importTextureFromArchive( const Q3BSP::Q3BSPModel *model,
                                                 ZipArchiveIOSystem *archive, aiScene*,
                                                 aiMaterial *pMatHelper, int textureId ) {
    if (nullptr == archive || nullptr == pMatHelper ) {
        return false;
    }

    if ( textureId < 0 || textureId >= static_cast<int>( model->m_Textures.size() ) ) {
        return false;
    }

    bool res = true;
    sQ3BSPTexture *pTexture = model->m_Textures[ textureId ];
    if ( !pTexture ) {
        return false;
    }

    std::vector<std::string> supportedExtensions;
    supportedExtensions.push_back( ".jpg" );
    supportedExtensions.push_back( ".png" );
    supportedExtensions.push_back( ".tga" );
    std::string textureName, ext;
    if ( expandFile( archive, pTexture->strName, supportedExtensions, textureName, ext ) ) {
        IOStream *pTextureStream = archive->Open( textureName.c_str() );
        if ( pTextureStream ) {
            size_t texSize = pTextureStream->FileSize();
            aiTexture *pTexture = new aiTexture;
            pTexture->mHeight = 0;
            pTexture->mWidth = static_cast<unsigned int>(texSize);
            unsigned char *pData = new unsigned char[ pTexture->mWidth ];
            size_t readSize = pTextureStream->Read( pData, sizeof( unsigned char ), pTexture->mWidth );
            (void)readSize;
            ai_assert( readSize == pTexture->mWidth );
            pTexture->pcData = reinterpret_cast<aiTexel*>( pData );
            pTexture->achFormatHint[ 0 ] = ext[ 1 ];
            pTexture->achFormatHint[ 1 ] = ext[ 2 ];
            pTexture->achFormatHint[ 2 ] = ext[ 3 ];
            pTexture->achFormatHint[ 3 ] = '\0';
            res = true;

            aiString name;
            name.data[ 0 ] = '*';
            name.length = 1 + ASSIMP_itoa10( name.data + 1, static_cast<unsigned int>(MAXLEN-1), static_cast<int32_t>(mTextures.size()) );

            archive->Close( pTextureStream );

            pMatHelper->AddProperty( &name, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
            mTextures.push_back( pTexture );
        } else {
            // If it doesn't exist in the archive, it is probably just a reference to an external file.
            // We'll leave it up to the user to figure out which extension the file has.
            aiString name;
            strncpy( name.data, pTexture->strName, sizeof name.data );
            name.length = strlen( name.data );
            pMatHelper->AddProperty( &name, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
        }
    }

    return res;
}